

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O0

void __thiscall SCCTest_TwoAndOne_Test::SCCTest_TwoAndOne_Test(SCCTest_TwoAndOne_Test *this)

{
  SCCTest_TwoAndOne_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__SCCTest_TwoAndOne_Test_00572870;
  return;
}

Assistant:

TEST(SCCTest, TwoAndOne) {
  // 0 <-> 1 -> 2
  Graph graph(3);
  graph.addEdge(0, 1);
  graph.addEdge(1, 0);
  graph.addEdge(1, 2);
  EXPECT_EQ(getSCCs(graph), (SCCSet{{0, 1}, {2}}));
}